

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
::InnerMap::TreeConvert(InnerMap *this,size_type b)

{
  _Rb_tree_header *p_Var1;
  void **ppvVar2;
  void *pvVar3;
  Arena *this_00;
  LogMessage *pLVar4;
  Tree *tree;
  size_type sVar5;
  size_type sVar6;
  void *pvVar7;
  LogFinisher local_61;
  _Node_allocator local_60;
  undefined1 local_50 [40];
  
  ppvVar2 = this->table_;
  pvVar3 = ppvVar2[b];
  if (pvVar3 == (void *)0x0) {
    pvVar7 = ppvVar2[b ^ 1];
LAB_00243936:
    if (pvVar7 != pvVar3 || pvVar7 == (void *)0x0) goto LAB_0024398a;
  }
  else {
    pvVar7 = ppvVar2[b ^ 1];
    if (pvVar3 != pvVar7) goto LAB_00243936;
  }
  internal::LogMessage::LogMessage
            ((LogMessage *)&local_60,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
             ,0x334);
  pLVar4 = internal::LogMessage::operator<<
                     ((LogMessage *)&local_60,
                      "CHECK failed: !TableEntryIsTree(b) && !TableEntryIsTree(b ^ 1): ");
  internal::LogFinisher::operator=(&local_61,pLVar4);
  internal::LogMessage::~LogMessage((LogMessage *)&local_60);
LAB_0024398a:
  this_00 = (this->alloc_).arena_;
  if (this_00 == (Arena *)0x0) {
    tree = (Tree *)operator_new(0x38);
  }
  else {
    tree = (Tree *)Arena::AllocateAligned(this_00,(type_info *)&unsigned_char::typeinfo,0x38);
  }
  local_60.arena_ = (this->alloc_).arena_;
  local_50._16_8_ = local_50;
  local_50._0_4_ = _S_red;
  local_50._8_8_ = (pointer)0x0;
  local_50._32_8_ = 0;
  (tree->_M_t)._M_impl.super__Node_allocator.arena_ = local_60.arena_;
  p_Var1 = &(tree->_M_t)._M_impl.super__Rb_tree_header;
  (tree->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (tree->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (tree->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (tree->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  (tree->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50._24_8_ = local_50._16_8_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
               *)&local_60);
  sVar5 = CopyListToTree(this,b,tree);
  sVar6 = CopyListToTree(this,b ^ 1,tree);
  if (sVar6 + sVar5 != (tree->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x33f);
    pLVar4 = internal::LogMessage::operator<<
                       ((LogMessage *)&local_60,"CHECK failed: (count) == (tree->size()): ");
    internal::LogFinisher::operator=(&local_61,pLVar4);
    internal::LogMessage::~LogMessage((LogMessage *)&local_60);
  }
  this->table_[b ^ 1] = tree;
  this->table_[b] = tree;
  return;
}

Assistant:

void TreeConvert(size_type b) {
      GOOGLE_DCHECK(!TableEntryIsTree(b) && !TableEntryIsTree(b ^ 1));
      typename Allocator::template rebind<Tree>::other tree_allocator(alloc_);
      Tree* tree = tree_allocator.allocate(1);
      // We want to use the three-arg form of construct, if it exists, but we
      // create a temporary and use the two-arg construct that's known to exist.
      // It's clunky, but the compiler should be able to generate more-or-less
      // the same code.
      tree_allocator.construct(tree,
                               Tree(KeyCompare(), KeyPtrAllocator(alloc_)));
      // Now the tree is ready to use.
      size_type count = CopyListToTree(b, tree) + CopyListToTree(b ^ 1, tree);
      GOOGLE_DCHECK_EQ(count, tree->size());
      table_[b] = table_[b ^ 1] = static_cast<void*>(tree);
    }